

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_selection_sort(int64_t *dst,size_t size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t _sort_swap_temp;
  
  if (1 < size) {
    uVar2 = 0;
    do {
      uVar3 = uVar2 + 1;
      for (uVar4 = uVar3; uVar4 < size; uVar4 = uVar4 + 1) {
        lVar1 = dst[uVar2];
        if (dst[uVar4] < lVar1) {
          dst[uVar2] = dst[uVar4];
          dst[uVar4] = lVar1;
        }
      }
      uVar2 = uVar3;
    } while (uVar3 != size);
  }
  return;
}

Assistant:

void SELECTION_SORT(SORT_TYPE *dst, const size_t size) {
  size_t i, j;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  for (i = 0; i < size; i++) {
    for (j = i + 1; j < size; j++) {
      if (SORT_CMP(dst[j], dst[i]) < 0) {
        SORT_SWAP(dst[i], dst[j]);
      }
    }
  }
}